

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debug.hpp
# Opt level: O3

size_t JEBDebug::internal::print_hex_numbers
                 (ostream *stream,void *data,size_t num_bytes,size_t num_numbers)

{
  long lVar1;
  ostream *poVar2;
  size_t sVar3;
  long lVar4;
  size_t sVar5;
  ostream local_3e;
  char local_3d;
  uint local_3c;
  size_t local_38;
  
  lVar4 = *(long *)stream;
  lVar1 = *(long *)(lVar4 + -0x18);
  local_3c = *(uint *)(stream + lVar1 + 0x18);
  *(uint *)(stream + lVar1 + 0x18) = local_3c & 0xffffffb5 | 8;
  lVar4 = *(long *)(lVar4 + -0x18);
  poVar2 = stream + lVar4;
  if (stream[lVar4 + 0xe1] == (ostream)0x1) {
    local_3e = poVar2[0xe0];
  }
  else {
    local_3e = (ostream)std::ios::widen((char)poVar2);
    poVar2[0xe1] = (ostream)0x1;
  }
  poVar2[0xe0] = (ostream)0x30;
  sVar5 = num_bytes;
  if (num_numbers < num_bytes) {
    sVar5 = num_numbers;
  }
  local_38 = num_bytes;
  if (sVar5 != 0) {
    sVar3 = 0;
    do {
      local_3d = ' ';
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(stream,&local_3d,1);
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 2;
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      sVar3 = sVar3 + 1;
    } while (sVar5 != sVar3);
  }
  if (local_38 < num_numbers) {
    lVar4 = num_numbers - sVar5;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"   ",3);
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  lVar4 = *(long *)stream;
  poVar2 = stream + *(long *)(lVar4 + -0x18);
  if (stream[*(long *)(lVar4 + -0x18) + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar2);
    poVar2[0xe1] = (ostream)0x1;
    lVar4 = *(long *)stream;
  }
  poVar2[0xe0] = local_3e;
  *(uint *)(stream + *(long *)(lVar4 + -0x18) + 0x18) = local_3c;
  return sVar5;
}

Assistant:

inline size_t print_hex_numbers(std::ostream& stream,
                                        const void* data, size_t num_bytes,
                                        size_t num_numbers)
        {
            auto flags = stream.setf(std::ios::hex, std::ios::basefield);
            auto fill = stream.fill('0');
            size_t i = 0;
            auto n = std::min(num_bytes, num_numbers);
            const auto* cdata = static_cast<const unsigned char*>(data);
            for (; i < n; ++i)
                stream << ' ' << std::setw(2) << unsigned(cdata[i]);
            for (; i < num_numbers; ++i)
                stream << "   ";
            stream.fill(fill);
            stream.flags(flags);
            return n;
        }